

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O0

void __thiscall
websocketpp::connection<websocketpp::config::asio>::handle_terminate
          (connection<websocketpp::config::asio> *this,terminate_status tstat,error_code *ec)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  function<void_(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>)> *this_01;
  error_code *in_RCX;
  error_code *in_RDX;
  int in_ESI;
  long in_RDI;
  exception *e;
  error_code *in_stack_00000108;
  char *in_stack_00000110;
  level in_stack_0000011c;
  connection<websocketpp::config::asio> *in_stack_00000120;
  connection<websocketpp::config::asio> *in_stack_00000150;
  error_code *in_stack_fffffffffffffef8;
  error_code *in_stack_ffffffffffffff00;
  shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *in_stack_ffffffffffffff08;
  function<void_(std::weak_ptr<void>)> *in_stack_ffffffffffffff10;
  connection<websocketpp::config::asio> *in_stack_ffffffffffffff18;
  error_code *in_stack_ffffffffffffff20;
  
  peVar2 = std::
           __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x337997);
  bVar1 = log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::static_test
                    (peVar2,0x400);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3379bb);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar2,0x400,"connection handle_terminate",(size_t)in_RCX);
  }
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    log_err<std::error_code>
              (in_stack_00000120,in_stack_0000011c,in_stack_00000110,in_stack_00000108);
    in_RCX = in_RDX;
  }
  if (in_ESI == 1) {
    std::error_code::error_code<websocketpp::error::value,void>
              (in_stack_ffffffffffffff20,(value)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    bVar1 = std::operator!=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if ((bVar1) &&
       (bVar1 = std::function::operator_cast_to_bool
                          ((function<void_(std::weak_ptr<void>)> *)0x337a5c), bVar1)) {
      std::weak_ptr<void>::weak_ptr
                ((weak_ptr<void> *)in_stack_ffffffffffffff00,
                 (weak_ptr<void> *)in_stack_fffffffffffffef8);
      std::function<void_(std::weak_ptr<void>)>::operator()
                (in_stack_ffffffffffffff10,(weak_ptr<void> *)in_stack_ffffffffffffff08);
      std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x337aac);
    }
  }
  else if (in_ESI == 2) {
    bVar1 = std::function::operator_cast_to_bool((function<void_(std::weak_ptr<void>)> *)0x337afa);
    if (bVar1) {
      in_stack_ffffffffffffff18 = (connection<websocketpp::config::asio> *)(in_RDI + 0x9f0);
      std::weak_ptr<void>::weak_ptr
                ((weak_ptr<void> *)in_stack_ffffffffffffff00,
                 (weak_ptr<void> *)in_stack_fffffffffffffef8);
      std::function<void_(std::weak_ptr<void>)>::operator()
                (in_stack_ffffffffffffff10,(weak_ptr<void> *)in_stack_ffffffffffffff08);
      std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x337b4a);
    }
    log_close_result(in_stack_00000150);
  }
  else {
    this_00 = std::
              __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x337b8f);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (this_00,0x10,"Unknown terminate_status",(size_t)in_RCX);
  }
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>)>
                      *)0x337bb6);
  if (bVar1) {
    this_01 = (function<void_(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>)>
               *)(in_RDI + 0x4b90);
    get_shared(in_stack_ffffffffffffff18);
    std::function<void_(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>)>::
    operator()(this_01,in_stack_ffffffffffffff08);
    std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>::~shared_ptr
              ((shared_ptr<websocketpp::connection<websocketpp::config::asio>_> *)0x337c02);
  }
  return;
}

Assistant:

void connection<config>::handle_terminate(terminate_status tstat,
    lib::error_code const & ec)
{
    if (m_alog->static_test(log::alevel::devel)) {
        m_alog->write(log::alevel::devel,"connection handle_terminate");
    }

    if (ec) {
        // there was an error actually shutting down the connection
        log_err(log::elevel::devel,"handle_terminate",ec);
    }

    // clean shutdown
    if (tstat == failed) {
        if (m_ec != error::http_connection_ended) {
            if (m_fail_handler) {
                m_fail_handler(m_connection_hdl);
            }
        }
    } else if (tstat == closed) {
        if (m_close_handler) {
            m_close_handler(m_connection_hdl);
        }
        log_close_result();
    } else {
        m_elog->write(log::elevel::rerror,"Unknown terminate_status");
    }

    // call the termination handler if it exists
    // if it exists it might (but shouldn't) refer to a bad memory location.
    // If it does, we don't care and should catch and ignore it.
    if (m_termination_handler) {
        try {
            m_termination_handler(type::get_shared());
        } catch (std::exception const & e) {
            m_elog->write(log::elevel::warn,
                std::string("termination_handler call failed. Reason was: ")+e.what());
        }
    }
}